

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckFrameSet(TidyDocImpl *doc,Node *node)

{
  tmbchar *ptVar1;
  long lVar2;
  char cVar3;
  uint uVar4;
  Node *pNVar5;
  Node *node_00;
  Lexer *pLVar6;
  bool bVar7;
  Bool BVar8;
  ctmbstr __haystack;
  char *pcVar9;
  ulong uVar10;
  tmbchar *ptVar11;
  tmbstr txt;
  Node *para;
  Node *node_01;
  
  if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) {
    return;
  }
  if ((doc->badAccess & 0x40) != 0) {
    prvTidyReportAccessError(doc,node,0x2df);
    *(byte *)&doc->badAccess = (byte)doc->badAccess & 0xbf;
  }
  node_01 = node->content;
  if (node_01 != (Node *)0x0) {
    ptVar1 = (doc->access).text;
    bVar7 = false;
    do {
      if ((node_01->tag != (Dict *)0x0) && (node_01->tag->id == TidyTag_NOFRAMES)) {
        pNVar5 = node_01->content;
        if (pNVar5 != (Node *)0x0) {
          node_00 = pNVar5->content;
          if (((node_00 != (Node *)0x0) && (node_00->tag != (Dict *)0x0)) &&
             (node_00->tag->id == TidyTag_P)) {
            BVar8 = prvTidynodeIsText(node_00->content);
            bVar7 = true;
            if (BVar8 != no) {
              __haystack = textFromOneNode(doc,node_00->content);
              pcVar9 = strstr(__haystack,"browser");
              if (pcVar9 != (char *)0x0) {
                prvTidyReportAccessError(doc,node_00,0x2de);
              }
            }
            goto LAB_0013461b;
          }
          if (pNVar5 != (Node *)0x0) {
            uVar4 = pNVar5->start;
            if (uVar4 < pNVar5->end) {
              pLVar6 = doc->lexer;
              uVar10 = 0;
              do {
                ptVar1[uVar10] = pLVar6->lexbuf[uVar10 + uVar4];
                if (uVar10 == 0x7f) {
                  uVar10 = 0x7f;
                  break;
                }
                lVar2 = uVar4 + uVar10;
                uVar10 = uVar10 + 1;
              } while (lVar2 + 1U < (ulong)pNVar5->end);
              uVar10 = uVar10 & 0xffffffff;
            }
            else {
              uVar10 = 0;
            }
            ptVar1[uVar10] = '\0';
            ptVar11 = ptVar1;
            do {
              cVar3 = *ptVar11;
              if (cVar3 == '\0') goto LAB_00134606;
              BVar8 = prvTidyIsWhite((int)cVar3);
              ptVar11 = ptVar11 + 1;
            } while (BVar8 != no);
            bVar7 = true;
            if (cVar3 != '\0') goto LAB_0013461b;
          }
        }
LAB_00134606:
        prvTidyReportAccessError(doc,node_01,0x2dd);
        bVar7 = true;
      }
LAB_0013461b:
      node_01 = node_01->next;
    } while (node_01 != (Node *)0x0);
    if (bVar7) {
      return;
    }
  }
  prvTidyReportAccessError(doc,node,0x2dc);
  return;
}

Assistant:

static void CheckFrameSet( TidyDocImpl* doc, Node* node )
{
    Node* temp;
    Bool HasNoFrames = no;

    if (Level1_Enabled( doc ))
    {
        if ( doc->badAccess & BA_INVALID_LINK_NOFRAMES )
        {
           TY_(ReportAccessError)( doc, node, NOFRAMES_INVALID_LINK);
           doc->badAccess &= ~BA_INVALID_LINK_NOFRAMES; /* emit only once */
        }
        for ( temp = node->content; temp != NULL ; temp = temp->next )
        {
            if ( nodeIsNOFRAMES(temp) )
            {
                HasNoFrames = yes;

                if ( temp->content && nodeIsP(temp->content->content) )
                {
                    Node* para = temp->content->content;
                    if ( TY_(nodeIsText)(para->content) )
                    {
                        ctmbstr word = textFromOneNode( doc, para->content );
                        if ( word && strstr(word, "browser") != NULL )
                            TY_(ReportAccessError)( doc, para, NOFRAMES_INVALID_CONTENT );
                    }
                }
                else if (temp->content == NULL)
                    TY_(ReportAccessError)( doc, temp, NOFRAMES_INVALID_NO_VALUE);
                else if ( temp->content &&
                          IsWhitespace(textFromOneNode(doc, temp->content)) )
                    TY_(ReportAccessError)( doc, temp, NOFRAMES_INVALID_NO_VALUE);
            }
        }

        if (HasNoFrames == no)
            TY_(ReportAccessError)( doc, node, FRAME_MISSING_NOFRAMES);
    }
}